

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall pbrt::CameraBase::CameraBase(CameraBase *this,CameraBaseParameters *p)

{
  uintptr_t uVar1;
  Float FVar2;
  bool bVar3;
  undefined1 auVar4 [32];
  
  memcpy(this,p,0x338);
  FVar2 = p->shutterClose;
  this->shutterOpen = p->shutterOpen;
  this->shutterClose = FVar2;
  this->film = (FilmHandle)SUB168(ZEXT816(0) << 0x20,0);
  this->medium = (MediumHandle)SUB168(ZEXT816(0) << 0x20,8);
  uVar1 = (p->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  (this->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (p->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  (this->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar1;
  auVar4 = ZEXT832(0) << 0x20;
  *(undefined1 (*) [32])&(this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y = auVar4;
  this->minPosDifferentialX = (Vector3f)auVar4._0_12_;
  this->minPosDifferentialY = (Vector3f)auVar4._12_12_;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar4._24_4_;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar4._28_4_;
  bVar3 = AnimatedTransform::HasScale((AnimatedTransform *)this);
  if (bVar3) {
    Warning<>(
             "Scaling detected in rendering space to camera space transformation!\nThe system has numerous assumptions, implicit and explicit,\nthat this transform will have no scale factors in it.\nProceed at your own risk; your image may have errors or\nthe system may crash as a result of this."
             );
    return;
  }
  return;
}

Assistant:

CameraBase::CameraBase(CameraBaseParameters p)
    : cameraTransform(p.cameraTransform),
      shutterOpen(p.shutterOpen),
      shutterClose(p.shutterClose),
      film(p.film),
      medium(p.medium) {
    if (cameraTransform.CameraFromRenderHasScale())
        Warning("Scaling detected in rendering space to camera space transformation!\n"
                "The system has numerous assumptions, implicit and explicit,\n"
                "that this transform will have no scale factors in it.\n"
                "Proceed at your own risk; your image may have errors or\n"
                "the system may crash as a result of this.");
}